

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-timer.c
# Opt level: O0

int run_test_timer_huge_timeout(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  uint64_t uVar3;
  int64_t eval_b_10;
  int64_t eval_a_10;
  int64_t eval_b_9;
  int64_t eval_a_9;
  uint64_t eval_b_8;
  uint64_t eval_a_8;
  uint64_t eval_b_7;
  uint64_t eval_a_7;
  uint64_t eval_b_6;
  uint64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_timer_init(puVar2,&tiny_timer);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-timer.c"
            ,0x118,"uv_timer_init(uv_default_loop(), &tiny_timer)","==","0",(long)iVar1,"==",0);
    abort();
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_timer_init(puVar2,&huge_timer1);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-timer.c"
            ,0x119,"uv_timer_init(uv_default_loop(), &huge_timer1)","==","0",(long)iVar1,"==",0);
    abort();
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_timer_init(puVar2,&huge_timer2);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-timer.c"
            ,0x11a,"uv_timer_init(uv_default_loop(), &huge_timer2)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_timer_start(&tiny_timer,tiny_timer_cb,1,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-timer.c"
            ,0x11b,"uv_timer_start(&tiny_timer, tiny_timer_cb, 1, 0)","==","0",(long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_timer_start(&huge_timer1,tiny_timer_cb,0xffffffffffff,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-timer.c"
            ,0x11f,"uv_timer_start(&huge_timer1, tiny_timer_cb, 0xffffffffffffLL, 0)","==","0",
            (long)iVar1,"==",0);
    abort();
  }
  iVar1 = uv_timer_start(&huge_timer2,tiny_timer_cb,0xffffffffffffffff,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-timer.c"
            ,0x120,"uv_timer_start(&huge_timer2, tiny_timer_cb, (uint64_t) -1, 0)","==","0",
            (long)iVar1,"==",0);
    abort();
  }
  uVar3 = uv_timer_get_due_in(&tiny_timer);
  if (uVar3 != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%lu %s %lu)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-timer.c"
            ,0x121,"1","==","uv_timer_get_due_in(&tiny_timer)",1,"==",uVar3);
    abort();
  }
  uVar3 = uv_timer_get_due_in(&huge_timer1);
  if (uVar3 == 0xffffffffffff) {
    uv_timer_get_due_in(&huge_timer2);
    puVar2 = uv_default_loop();
    iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
    if ((long)iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-timer.c"
              ,0x124,"uv_run(uv_default_loop(), UV_RUN_DEFAULT)","==","0",(long)iVar1,"==",0);
      abort();
    }
    puVar2 = uv_default_loop();
    close_loop(puVar2);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if ((long)iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-timer.c"
            ,0x125,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
    abort();
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%lu %s %lu)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-timer.c"
          ,0x122,"281474976710655","==","uv_timer_get_due_in(&huge_timer1)",0xffffffffffff,"==",
          uVar3);
  abort();
}

Assistant:

TEST_IMPL(timer_huge_timeout) {
  ASSERT_OK(uv_timer_init(uv_default_loop(), &tiny_timer));
  ASSERT_OK(uv_timer_init(uv_default_loop(), &huge_timer1));
  ASSERT_OK(uv_timer_init(uv_default_loop(), &huge_timer2));
  ASSERT_OK(uv_timer_start(&tiny_timer, tiny_timer_cb, 1, 0));
  ASSERT_OK(uv_timer_start(&huge_timer1,
                           tiny_timer_cb,
                           0xffffffffffffLL,
                           0));
  ASSERT_OK(uv_timer_start(&huge_timer2, tiny_timer_cb, (uint64_t) -1, 0));
  ASSERT_UINT64_EQ(1, uv_timer_get_due_in(&tiny_timer));
  ASSERT_UINT64_EQ(281474976710655, uv_timer_get_due_in(&huge_timer1));
  ASSERT_UINT64_LE(0, uv_timer_get_due_in(&huge_timer2));
  ASSERT_OK(uv_run(uv_default_loop(), UV_RUN_DEFAULT));
  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}